

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void mbedtls_debug_print_crt
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,
               mbedtls_x509_crt *crt)

{
  int iVar1;
  size_t __n;
  long lVar2;
  char *buf_00;
  char *pcVar3;
  char *pcVar4;
  char local_868 [8];
  char str [512];
  char buf [1024];
  char str_1 [512];
  
  if ((((ssl == (mbedtls_ssl_context *)0x0) || (ssl->conf == (mbedtls_ssl_config *)0x0)) ||
      (crt == (mbedtls_x509_crt *)0x0)) ||
     ((ssl->conf->f_dbg == (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0 ||
      (debug_threshold < level)))) {
    return;
  }
LAB_0019fb19:
  snprintf(local_868,0x200,"%s #%d:\n",text);
  (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_868);
  buf_00 = str + 0x1f8;
  mbedtls_x509_crt_info(buf_00,0x3ff,anon_var_dwarf_434f87 + 9,crt);
  pcVar3 = str + 0x1f9;
  pcVar4 = pcVar3;
  do {
    if (pcVar3[-1] == '\n') {
      __n = (long)pcVar4 - (long)buf_00;
      if (0x1fe < __n) {
        __n = 0x1ff;
      }
      memcpy(buf + 0x3f8,buf_00,__n);
      buf[__n + 0x3f8] = '\0';
      (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,buf + 0x3f8);
      buf_00 = pcVar3;
    }
    else if (pcVar3[-1] == '\0') break;
    pcVar3 = pcVar3 + 1;
    pcVar4 = pcVar4 + 1;
  } while( true );
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  str_1[0] = '\0';
  str_1[1] = '\0';
  str_1[2] = '\0';
  str_1[3] = '\0';
  str_1[4] = '\0';
  str_1[5] = '\0';
  str_1[6] = '\0';
  str_1[7] = '\0';
  str_1[8] = '\0';
  str_1[9] = '\0';
  str_1[10] = '\0';
  str_1[0xb] = '\0';
  str_1[0xc] = '\0';
  str_1[0xd] = '\0';
  str_1[0xe] = '\0';
  str_1[0xf] = '\0';
  str_1[0x10] = '\0';
  str_1[0x11] = '\0';
  str_1[0x12] = '\0';
  str_1[0x13] = '\0';
  str_1[0x14] = '\0';
  str_1[0x15] = '\0';
  str_1[0x16] = '\0';
  str_1[0x17] = '\0';
  str_1[0x18] = '\0';
  str_1[0x19] = '\0';
  str_1[0x1a] = '\0';
  str_1[0x1b] = '\0';
  str_1[0x1c] = '\0';
  str_1[0x1d] = '\0';
  str_1[0x1e] = '\0';
  str_1[0x1f] = '\0';
  str_1[0x20] = '\0';
  str_1[0x21] = '\0';
  str_1[0x22] = '\0';
  str_1[0x23] = '\0';
  str_1[0x24] = '\0';
  str_1[0x25] = '\0';
  str_1[0x26] = '\0';
  str_1[0x27] = '\0';
  str_1[0x28] = '\0';
  str_1[0x29] = '\0';
  str_1[0x2a] = '\0';
  str_1[0x2b] = '\0';
  str_1[0x2c] = '\0';
  str_1[0x2d] = '\0';
  str_1[0x2e] = '\0';
  str_1[0x2f] = '\0';
  str_1[0x30] = '\0';
  str_1[0x31] = '\0';
  str_1[0x32] = '\0';
  str_1[0x33] = '\0';
  str_1[0x34] = '\0';
  str_1[0x35] = '\0';
  str_1[0x36] = '\0';
  str_1[0x37] = '\0';
  str_1[0x38] = '\0';
  str_1[0x39] = '\0';
  str_1[0x3a] = '\0';
  str_1[0x3b] = '\0';
  str_1[0x3c] = '\0';
  str_1[0x3d] = '\0';
  str_1[0x3e] = '\0';
  str_1[0x3f] = '\0';
  iVar1 = mbedtls_pk_debug(&crt->pk,(mbedtls_pk_debug_item *)(buf + 0x3f8));
  if (iVar1 == 0) {
    lVar2 = 0;
    do {
      if (*(int *)(buf + lVar2 + 0x3f8) == 0) break;
      snprintf(str_1 + 0x1f8,0x10,"%s%s","crt->",*(undefined8 *)(str_1 + lVar2));
      if (*(int *)(buf + lVar2 + 0x3f8) == 2) {
        mbedtls_debug_print_ecp
                  (ssl,level,file,line,str_1 + 0x1f8,*(mbedtls_ecp_point **)(str_1 + lVar2 + 8));
      }
      else {
        (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,"should not happen\n");
      }
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x48);
  }
  else {
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,"invalid PK context\n");
  }
  crt = crt->next;
  if (crt == (mbedtls_x509_crt *)0x0) {
    return;
  }
  goto LAB_0019fb19;
}

Assistant:

void mbedtls_debug_print_crt(const mbedtls_ssl_context *ssl, int level,
                             const char *file, int line,
                             const char *text, const mbedtls_x509_crt *crt)
{
    char str[DEBUG_BUF_SIZE];
    int i = 0;

    if (NULL == ssl              ||
        NULL == ssl->conf        ||
        NULL == ssl->conf->f_dbg ||
        NULL == crt              ||
        level > debug_threshold) {
        return;
    }

    while (crt != NULL) {
        char buf[1024];

        mbedtls_snprintf(str, sizeof(str), "%s #%d:\n", text, ++i);
        debug_send_line(ssl, level, file, line, str);

        mbedtls_x509_crt_info(buf, sizeof(buf) - 1, "", crt);
        debug_print_line_by_line(ssl, level, file, line, buf);

        debug_print_pk(ssl, level, file, line, "crt->", &crt->pk);

        crt = crt->next;
    }
}